

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O3

void testDWATable(string *param_1)

{
  size_t endValue;
  ulong uVar1;
  char cVar2;
  ushort uVar3;
  imath_half_uif_t v;
  uint uVar4;
  LutHeaderWorker *pLVar5;
  char *func;
  float fVar6;
  size_t startValue;
  int i;
  long lVar7;
  int i_1;
  ulong uVar8;
  float fVar9;
  float fVar10;
  unsigned_short toLinear [65536];
  LutHeaderWorker *apLStack_20048 [2];
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  avStack_20038 [5461];
  
  lVar7 = 1;
  do {
    if ((~(uint)lVar7 & 0x7c00) == 0) {
      *(undefined2 *)
       ((long)&avStack_20038[0].
               super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) = 0;
    }
    else {
      fVar9 = *(float *)(_imath_half_to_float_table + lVar7 * 4);
      fVar6 = *(float *)(&DAT_00182cf8 + (ulong)(fVar9 < 0.0) * 4);
      fVar9 = ABS(fVar9);
      if (fVar9 <= 1.0) {
        fVar10 = 2.2;
      }
      else {
        fVar10 = fVar9 + -1.0;
        fVar9 = 9.025013;
      }
      fVar10 = powf(fVar9,fVar10);
      fVar9 = ABS(fVar6 * fVar10);
      uVar3 = (ushort)((uint)(fVar6 * fVar10) >> 0x10) & 0x8000;
      if ((uint)fVar9 < 0x38800000) {
        if ((0x33000000 < (uint)fVar9) &&
           (uVar4 = (uint)fVar9 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar9 >> 0x17),
           uVar3 = uVar3 | (ushort)(uVar4 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar4 << (cVar2 + 0xa2U & 0x1f))) {
          uVar3 = uVar3 + 1;
        }
      }
      else if ((uint)fVar9 < 0x7f800000) {
        if ((uint)fVar9 < 0x477ff000) {
          uVar3 = (ushort)((int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd) |
                  uVar3;
        }
        else {
          uVar3 = uVar3 | 0x7c00;
        }
      }
      else {
        uVar3 = uVar3 | 0x7c00;
        if (fVar9 != INFINITY) {
          uVar4 = (uint)fVar9 >> 0xd & 0x3ff;
          uVar3 = uVar3 | (ushort)uVar4 | (ushort)(uVar4 == 0);
        }
      }
      *(char *)((long)&avStack_20038[0].
                       super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) = (char)uVar3;
      *(char *)((long)&avStack_20038[0].
                       super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2 + 1) =
           (char)(uVar3 >> 8);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10000);
  puts("test dwaCompressorToLinear[]");
  lVar7 = 0;
  func = "";
  do {
    if (*(short *)((long)&avStack_20038[0].
                          super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar7) !=
        *(short *)((long)&internal_test_ns::dwaCompressorToLinear + lVar7)) {
      core_test_fail("toLinear[i] == internal_test_ns::dwaCompressorToLinear[i]",(char *)0x138,
                     0x343308,func);
      goto LAB_0011875f;
    }
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0x20000);
  lVar7 = 1;
  do {
    if ((~(uint)lVar7 & 0x7c00) == 0) {
      uVar3 = 0;
    }
    else {
      fVar9 = *(float *)(_imath_half_to_float_table + lVar7 * 4);
      fVar6 = *(float *)(&DAT_00182cf8 + (ulong)(fVar9 < 0.0) * 4);
      fVar9 = ABS(fVar9);
      if (fVar9 <= 1.0) {
        fVar9 = powf(fVar9,0.45454544);
      }
      else {
        fVar9 = logf(fVar9);
        fVar9 = fVar9 / 2.2 + 1.0;
      }
      fVar9 = fVar9 * fVar6;
      fVar6 = ABS(fVar9);
      uVar3 = (ushort)((uint)fVar9 >> 0x10) & 0x8000;
      if ((uint)fVar6 < 0x38800000) {
        if ((0x33000000 < (uint)fVar6) &&
           (uVar4 = (uint)fVar9 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar6 >> 0x17),
           uVar3 = uVar3 | (ushort)(uVar4 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar4 << (cVar2 + 0xa2U & 0x1f))) {
          uVar3 = uVar3 + 1;
        }
      }
      else if ((uint)fVar6 < 0x7f800000) {
        if ((uint)fVar6 < 0x477ff000) {
          uVar3 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd) |
                  uVar3;
        }
        else {
          uVar3 = uVar3 | 0x7c00;
        }
      }
      else {
        uVar3 = uVar3 | 0x7c00;
        if (fVar6 != INFINITY) {
          uVar4 = (uint)fVar6 >> 0xd & 0x3ff;
          uVar3 = uVar3 | (ushort)uVar4 | (ushort)(uVar4 == 0);
        }
      }
    }
    *(ushort *)
     ((long)&avStack_20038[0].
             super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) = uVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10000);
  puts("test dwaCompressorToNonlinear[]");
  lVar7 = 0;
  func = "";
  do {
    if (*(short *)((long)&avStack_20038[0].
                          super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar7) !=
        *(short *)((long)&internal_test_ns::dwaCompressorToNonlinear + lVar7)) {
LAB_0011875f:
      core_test_fail("toNonlinear[i] == internal_test_ns::dwaCompressorToNonlinear[i]",(char *)0x16e
                     ,0x34335c,func);
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0x20000);
  uVar8 = 1;
  cVar2 = IlmThread_3_4::supportsThreads();
  if (cVar2 != '\0') {
    uVar4 = std::thread::hardware_concurrency();
    uVar8 = 1;
    if (1 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
  }
  uVar1 = 0x10000 / uVar8;
  lVar7 = uVar8 - 1;
  startValue = 0;
  do {
    if (uVar8 == 1) {
      pLVar5 = (LutHeaderWorker *)operator_new(0x30);
      anon_unknown.dwarf_36ca0::LutHeaderWorker::LutHeaderWorker(pLVar5,lVar7 * uVar1,0x10000);
      apLStack_20048[0] = pLVar5;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back(avStack_20038,apLStack_20048);
      break;
    }
    pLVar5 = (LutHeaderWorker *)operator_new(0x30);
    endValue = uVar1 + startValue;
    anon_unknown.dwarf_36ca0::LutHeaderWorker::LutHeaderWorker(pLVar5,startValue,endValue);
    apLStack_20048[0] = pLVar5;
    std::
    vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
    ::push_back(avStack_20038,apLStack_20048);
    uVar8 = uVar8 - 1;
    startValue = endValue;
  } while (uVar8 != 0);
  IlmThread_3_4::supportsThreads();
  puts("test closestDataOffset[]");
  puts("test closestData[]");
  return;
}

Assistant:

static void
testToLinear ()
{
    unsigned short toLinear[65536];

    toLinear[0] = 0;

    for (int i = 1; i < 65536; ++i)
    {
        half  h;
        float sign    = 1;
        float logBase = pow (2.7182818, 2.2);

        // map  NaN and inf to 0
        if ((i & 0x7c00) == 0x7c00)
        {
            toLinear[i] = 0;
            continue;
        }

        //
        // _toLinear - assume i is NATIVE, but our output needs
        //             to get flipped to XDR
        //
        h.setBits (i);
        sign = 1;
        if ((float) h < 0) { sign = -1; }

        if (fabs ((float) h) <= 1.0)
        {
            h = (half) (sign * pow ((float) fabs ((float) h), 2.2f));
        }
        else
        {
            h = (half) (sign * pow (logBase, (float) (fabs ((float) h) - 1.0)));
        }

        {
            char* tmp = (char*) (&toLinear[i]);

            Xdr::write<CharPtrIO> (tmp, h.bits ());
        }
    }

    printf ("test dwaCompressorToLinear[]\n");
    for (int i = 0; i < 65536; ++i)
        EXRCORE_TEST (
            toLinear[i] ==
            internal_test_ns::dwaCompressorToLinear[i]);
}